

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O2

vector<Token,_std::allocator<Token>_> *
Tokenize(vector<Token,_std::allocator<Token>_> *__return_storage_ptr__,istream *cl)

{
  int iVar1;
  istream *piVar2;
  logic_error *this;
  char cVar3;
  int i;
  int iVar4;
  char c;
  Token local_78;
  string date;
  
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
switchD_001082cf_caseD_3f:
  piVar2 = std::operator>>(cl,&c);
  if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
    return __return_storage_ptr__;
  }
  if (9 < (int)c - 0x30U) goto LAB_00108344;
  date._M_dataplus._M_p = (pointer)&date.field_2;
  std::__cxx11::string::_M_construct((ulong)&date,'\x01');
  for (iVar4 = 0; iVar4 != 3; iVar4 = iVar4 + 1) {
    while( true ) {
      iVar1 = std::istream::peek();
      cVar3 = (char)&date;
      if (9 < iVar1 - 0x30U) break;
      std::istream::get();
      std::__cxx11::string::push_back(cVar3);
    }
    if (iVar4 != 2) {
      std::istream::get();
      std::__cxx11::string::push_back(cVar3);
    }
  }
  std::__cxx11::string::string((string *)&local_78,(string *)&date);
  local_78.type = DATE;
  std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>(__return_storage_ptr__,&local_78);
  goto LAB_0010832f;
LAB_00108344:
  switch(c) {
  case '!':
    iVar4 = std::istream::get();
    if (iVar4 != 0x3d) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"Unknown token");
      goto LAB_00108725;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"!=",(allocator<char> *)&date);
    local_78.type = COMPARE_OP;
    std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
              (__return_storage_ptr__,&local_78);
    break;
  case '\"':
    date._M_dataplus._M_p = (pointer)&date.field_2;
    date._M_string_length = 0;
    date.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>(cl,(string *)&date,'\"');
    std::__cxx11::string::string((string *)&local_78,(string *)&date);
    local_78.type = EVENT;
    std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
              (__return_storage_ptr__,&local_78);
LAB_0010832f:
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&date);
  case '#':
  case '$':
  case '%':
  case '&':
  case '\'':
    goto switchD_001082cf_caseD_3f;
  case '(':
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"(",(allocator<char> *)&date);
    local_78.type = PAREN_LEFT;
    std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
              (__return_storage_ptr__,&local_78);
    break;
  case ')':
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,")",(allocator<char> *)&date);
    local_78.type = PAREN_RIGHT;
    std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
              (__return_storage_ptr__,&local_78);
    break;
  default:
    switch(c) {
    case '<':
      iVar4 = std::istream::peek();
      if (iVar4 == 0x3d) {
        std::istream::get();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"<=",(allocator<char> *)&date);
        local_78.type = COMPARE_OP;
        std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                  (__return_storage_ptr__,&local_78);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"<",(allocator<char> *)&date);
        local_78.type = COMPARE_OP;
        std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                  (__return_storage_ptr__,&local_78);
      }
      break;
    case '=':
      iVar4 = std::istream::get();
      if (iVar4 != 0x3d) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this,"Unknown token");
LAB_00108725:
        __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"==",(allocator<char> *)&date);
      local_78.type = COMPARE_OP;
      std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                (__return_storage_ptr__,&local_78);
      break;
    case '>':
      iVar4 = std::istream::peek();
      if (iVar4 == 0x3d) {
        std::istream::get();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,">=",(allocator<char> *)&date);
        local_78.type = COMPARE_OP;
        std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                  (__return_storage_ptr__,&local_78);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,">",(allocator<char> *)&date);
        local_78.type = COMPARE_OP;
        std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                  (__return_storage_ptr__,&local_78);
      }
      break;
    case '?':
    case '@':
      goto switchD_001082cf_caseD_3f;
    case 'A':
      iVar4 = std::istream::get();
      if ((iVar4 != 0x4e) || (iVar4 = std::istream::get(), iVar4 != 0x44)) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this,"Unknown token");
        goto LAB_00108725;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"AND",(allocator<char> *)&date);
      local_78.type = LOGICAL_OP;
      std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                (__return_storage_ptr__,&local_78);
      break;
    default:
      if (c == 'O') {
        iVar4 = std::istream::get();
        if (iVar4 != 0x52) {
          this = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this,"Unknown token");
          goto LAB_00108725;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"OR",(allocator<char> *)&date);
        local_78.type = LOGICAL_OP;
        std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                  (__return_storage_ptr__,&local_78);
      }
      else if (c == 'd') {
        iVar4 = std::istream::get();
        if (((iVar4 != 0x61) || (iVar4 = std::istream::get(), iVar4 != 0x74)) ||
           (iVar4 = std::istream::get(), iVar4 != 0x65)) {
          this = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this,"Unknown token");
          goto LAB_00108725;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"date",(allocator<char> *)&date);
        local_78.type = COLUMN;
        std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                  (__return_storage_ptr__,&local_78);
      }
      else {
        if (c != 'e') goto switchD_001082cf_caseD_3f;
        iVar4 = std::istream::get();
        if (((iVar4 != 0x76) || (iVar4 = std::istream::get(), iVar4 != 0x65)) ||
           ((iVar4 = std::istream::get(), iVar4 != 0x6e ||
            (iVar4 = std::istream::get(), iVar4 != 0x74)))) {
          this = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this,"Unknown token");
          goto LAB_00108725;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"event",(allocator<char> *)&date);
        local_78.type = COLUMN;
        std::vector<Token,_std::allocator<Token>_>::emplace_back<Token>
                  (__return_storage_ptr__,&local_78);
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_78);
  goto switchD_001082cf_caseD_3f;
}

Assistant:

vector<Token> Tokenize(istream& cl) {
  vector<Token> tokens;

  char c;
  while (cl >> c) {
    if (isdigit(c)) {
      string date(1, c);
      for (int i = 0; i < 3; ++i) {
        while (isdigit(cl.peek())) {
          date += cl.get();
        }
        if (i < 2) {
          date += cl.get(); // Consume '-'
        }
      }
      tokens.push_back({date, TokenType::DATE});
    } else if (c == '"') {
      string event;
      getline(cl, event, '"');
      tokens.push_back({event, TokenType::EVENT});
    } else if (c == 'd') {
      if (cl.get() == 'a' && cl.get() == 't' && cl.get() == 'e') {
        tokens.push_back({"date", TokenType::COLUMN});
      } else {
        throw logic_error("Unknown token");
      }
    } else if (c == 'e') {
      if (cl.get() == 'v' && cl.get() == 'e' && cl.get() == 'n' &&
          cl.get() == 't') {
        tokens.push_back({"event", TokenType::COLUMN});
      } else {
        throw logic_error("Unknown token");
      }
    } else if (c == 'A') {
      if (cl.get() == 'N' && cl.get() == 'D') {
        tokens.push_back({"AND", TokenType::LOGICAL_OP});
      } else {
        throw logic_error("Unknown token");
      }
    } else if (c == 'O') {
      if (cl.get() == 'R') {
        tokens.push_back({"OR", TokenType::LOGICAL_OP});
      } else {
        throw logic_error("Unknown token");
      }
    } else if (c == '(') {
      tokens.push_back({"(", TokenType::PAREN_LEFT});
    } else if (c == ')') {
      tokens.push_back({")", TokenType::PAREN_RIGHT});
    } else if (c == '<') {
      if (cl.peek() == '=') {
        cl.get();
        tokens.push_back({"<=", TokenType::COMPARE_OP});
      } else {
        tokens.push_back({"<", TokenType::COMPARE_OP});
      }
    } else if (c == '>') {
      if (cl.peek() == '=') {
        cl.get();
        tokens.push_back({">=", TokenType::COMPARE_OP});
      } else {
        tokens.push_back({">", TokenType::COMPARE_OP});
      }
    } else if (c == '=') {
      if (cl.get() == '=') {
        tokens.push_back({"==", TokenType::COMPARE_OP});
      } else {
        throw logic_error("Unknown token");
      }
    } else if (c == '!') {
      if (cl.get() == '=') {
        tokens.push_back({"!=", TokenType::COMPARE_OP});
      } else {
        throw logic_error("Unknown token");
      }
    }
  }

  return tokens;
}